

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

Col_Word Col_Subrope(Col_Word rope,size_t first,size_t last)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  Cell *pacVar7;
  Col_Word CVar8;
  ulong *puVar9;
  byte bVar10;
  undefined1 *data;
  size_t max;
  undefined8 local_b0;
  Col_StringFormat local_a8;
  undefined1 local_a4 [100];
  undefined8 local_40;
  size_t sStack_38;
  
  do {
    local_b0 = (ulong *)rope;
    if ((ulong *)rope == (ulong *)0x0) {
      puVar9 = (ulong *)0x0;
    }
    else {
      puVar9 = (ulong *)rope;
      if ((rope & 0xf) == 0) {
        if (((byte)*(ulong *)rope & 2) == 0) goto LAB_0010a14f;
        uVar2 = (byte)*(ulong *)rope & 0xfffffffe;
      }
      else {
        uVar2 = immediateWordTypes[(uint)rope & 0x1f];
      }
      if ((uVar2 == 2) && ((*(ulong *)rope & 0xc0000) == 0)) {
        local_b0 = *(ulong **)(rope + 0x10);
        puVar9 = local_b0;
      }
    }
LAB_0010a14f:
    if (last < first) {
      return 0xc;
    }
    sVar4 = Col_RopeLength((Col_Word)puVar9);
    if (sVar4 <= first) {
      return 0xc;
    }
    if (sVar4 <= last) {
      last = sVar4 - 1;
    }
    max = (last - first) + 1;
    if ((first == 0) && (max == sVar4)) {
      return (Col_Word)puVar9;
    }
    if (puVar9 == (ulong *)0x0) {
LAB_0010a279:
      bVar10 = 0;
      goto LAB_0010a27b;
    }
    if (((ulong)puVar9 & 0xf) == 0) {
      if (((byte)*puVar9 & 2) != 0) {
        uVar2 = (byte)*puVar9 & 0xfffffffe;
        goto LAB_0010a1ae;
      }
LAB_0010a220:
      pcVar1 = *(code **)((*puVar9 & 0xfffffffffffffffe) + 0x40);
      if ((pcVar1 != (code *)0x0) && (CVar8 = (*pcVar1)(puVar9,first,last), CVar8 != 0)) {
        return CVar8;
      }
      goto LAB_0010a279;
    }
    uVar2 = immediateWordTypes[(uint)puVar9 & 0x1f];
LAB_0010a1ae:
    if (uVar2 == 0x12) {
      uVar5 = (ulong)*(ushort *)((long)puVar9 + 2);
      if (uVar5 == 0) {
        uVar5 = Col_RopeLength(puVar9[2]);
      }
      uVar6 = -uVar5;
      if (uVar5 <= last) {
        if (uVar5 <= first) {
          puVar9 = puVar9 + 3;
          goto LAB_0010a20e;
        }
        bVar10 = *(byte *)((long)puVar9 + 1);
LAB_0010a27b:
        if (max < 0x61) {
          local_40 = 0;
          sStack_38 = 0;
          iVar3 = Col_TraverseRopeChunks
                            ((Col_Word)puVar9,first,max,0,MergeRopeChunksProc,&local_a8,
                             (size_t *)0x0);
          if (iVar3 == 0) {
            data = local_a4;
            max = sStack_38;
LAB_0010a2f1:
            CVar8 = Col_NewRope(local_a8,data,max);
            return CVar8;
          }
        }
        pacVar7 = AllocCells(1);
        (*pacVar7)[0] = '\x0e';
        (*pacVar7)[1] = bVar10;
        *(ulong **)(*pacVar7 + 8) = puVar9;
        *(size_t *)(*pacVar7 + 0x10) = first;
        *(size_t *)(*pacVar7 + 0x18) = last;
        return (Col_Word)pacVar7;
      }
      rope = puVar9[2];
    }
    else {
      bVar10 = 0;
      if ((int)uVar2 < -1) {
        if (uVar2 != 0xfffffffb) {
          if (uVar2 == 0xfffffffc) {
            return (Col_Word)puVar9;
          }
          goto LAB_0010a27b;
        }
        data = (undefined1 *)((long)&local_b0 + first + 1);
        local_a8 = COL_UCS1;
        goto LAB_0010a2f1;
      }
      if (uVar2 != 0xe) {
        if (uVar2 == 6) {
          uVar6 = (ulong)((int)(char)*(byte *)((long)puVar9 + 1) & (COL_UCS4|COL_UCS2|COL_UCS1));
          sVar4 = max * uVar6;
          if (sVar4 < 0x5d) {
            CVar8 = Col_NewRope((int)(char)*(byte *)((long)puVar9 + 1),
                                (byte *)((long)puVar9 + first * uVar6 + 4),sVar4);
            return CVar8;
          }
          goto LAB_0010a279;
        }
        bVar10 = 0;
        if (uVar2 == 0xffffffff) goto LAB_0010a220;
        goto LAB_0010a27b;
      }
      uVar6 = puVar9[2];
      puVar9 = puVar9 + 1;
LAB_0010a20e:
      last = last + uVar6;
      first = first + uVar6;
      rope = *puVar9;
    }
  } while( true );
}

Assistant:

Col_Word
Col_Subrope(
    Col_Word rope,              /*!< The rope to extract the subrope from. */
    size_t first,               /*!< Index of first character in subrope. */
    size_t last)                /*!< Index of last character in subrope. */
{
    Col_Word subrope;           /* Resulting rope in the general case. */
    size_t ropeLength;          /* Length of source rope. */
    unsigned char depth=0;      /* Depth of source rope. */
    size_t length;              /* Length of resulting subrope. */

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_ROPE,rope} */
    TYPECHECK_ROPE(rope) return WORD_NIL;

    WORD_UNWRAP(rope);

    /*
     * Quick cases.
     */

    if (last < first) {
        /*
         * Invalid range.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    ropeLength = Col_RopeLength(rope);
    if (first >= ropeLength) {
        /*
         * Beginning is past the end of the string.
         */

        return WORD_SMALLSTR_EMPTY;
    }

    if (last >= ropeLength) {
        /*
         * Truncate overlong subropes. (Note: at this point ropeLength > 1)
         */

        last = ropeLength-1;
    }

    length = last-first+1;

    if (first == 0 && length == ropeLength) {
        /*
         * Identity.
         */

        return rope;
    }

    /*
     * Type-specific quick cases.
     */

    switch (WORD_TYPE(rope)) {
    /*
     * Immediate types.
     */

    case WORD_TYPE_CHARBOOL:
        /*
         * Identity, already done.
         */

        ASSERT(WORD_CHAR_WIDTH(rope));
        ASSERT(0);
        return rope;

    case WORD_TYPE_SMALLSTR:
        return Col_NewRope(COL_UCS1, WORD_SMALLSTR_DATA(rope)+first, length);

    /*
     * Handle fixed width leaf ropes directly; this will be faster than the
     * generic case below.
     */

    case WORD_TYPE_UCSSTR: {
        Col_StringFormat format = (Col_StringFormat) WORD_UCSSTR_FORMAT(rope);
        if (length * CHAR_WIDTH(format) <= MAX_SHORT_LEAF_SIZE
                - UCSSTR_HEADER_SIZE) {
            return Col_NewRope(format, WORD_UCSSTR_DATA(rope)
                    + first * CHAR_WIDTH(format),
                    length * CHAR_WIDTH(format));
        }
        break;
        }

    case WORD_TYPE_SUBROPE:
        /*
         * Point to original source.
         */

        return Col_Subrope(WORD_SUBROPE_SOURCE(rope),
                WORD_SUBROPE_FIRST(rope)+first,
                WORD_SUBROPE_FIRST(rope)+last);

    case WORD_TYPE_CONCATROPE: {
        /*
         * Try to find the deepest superset of the subrope.
         */

        size_t leftLength = WORD_CONCATROPE_LEFT_LENGTH(rope);
        if (leftLength == 0) {
            leftLength = Col_RopeLength(WORD_CONCATROPE_LEFT(rope));
        }
        if (last < leftLength) {
            /*
             * Left arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_LEFT(rope), first, last);
        } else if (first >= leftLength) {
            /*
             * Right arm is a superset of subrope.
             */

            return Col_Subrope(WORD_CONCATROPE_RIGHT(rope), first-leftLength,
                    last-leftLength);
        }
        depth = WORD_CONCATROPE_DEPTH(rope);
        break;
        }

    case WORD_TYPE_CUSTOM: {
        Col_CustomRopeType *typeInfo
                = (Col_CustomRopeType *) WORD_TYPEINFO(rope);
        ASSERT(typeInfo->type.type == COL_ROPE);
        if (typeInfo->subropeProc) {
            if ((subrope = typeInfo->subropeProc(rope, first, last))
                    != WORD_NIL) {
                return subrope;
            }
        }
        break;
        }

        /* WORD_TYPE_UNKNOWN */
    }

    /*
     * Try to build a short subrope if possible.
     *
     * Make the test on char length, the traversal will check for byte length.
     */

    if (length <= MAX_SHORT_LEAF_SIZE) {
        MergeRopeChunksInfo info;
        info.length = 0;
        info.byteLength = 0;

        if (Col_TraverseRopeChunks(rope, first, length, 0, MergeRopeChunksProc,
                &info, NULL) == 0) {
            /*
             * Zero result means data fits into one short leaf.
             */

            return Col_NewRope(info.format, info.data, info.byteLength);
        }
    }

    /*
     * General case: build a subrope node.
     */

    subrope = (Col_Word) AllocCells(1);
    WORD_SUBROPE_INIT(subrope, depth, rope, first, last);

    return subrope;
}